

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::append(AsyncLogging *this,char *logline,int len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  FixedBuffer<4000000> *this_00;
  MutexLockGuard local_28;
  MutexLockGuard lock;
  int len_local;
  char *logline_local;
  AsyncLogging *this_local;
  
  lock.mutex._4_4_ = len;
  MutexLockGuard::MutexLockGuard(&local_28,&this->mutex_);
  peVar3 = std::__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->currentBuffer_);
  iVar2 = FixedBuffer<4000000>::avail(peVar3);
  if (lock.mutex._4_4_ < iVar2) {
    peVar3 = std::
             __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->currentBuffer_);
    FixedBuffer<4000000>::append(peVar3,logline,(long)lock.mutex._4_4_);
  }
  else {
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::push_back(&this->buffers_,&this->currentBuffer_);
    std::__shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->currentBuffer_).
                super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->nextBuffer_);
    if (bVar1) {
      std::shared_ptr<FixedBuffer<4000000>_>::operator=(&this->currentBuffer_,&this->nextBuffer_);
    }
    else {
      this_00 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
      FixedBuffer<4000000>::FixedBuffer(this_00);
      std::__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2>::
      reset<FixedBuffer<4000000>>
                ((__shared_ptr<FixedBuffer<4000000>,(__gnu_cxx::_Lock_policy)2> *)
                 &this->currentBuffer_,this_00);
    }
    peVar3 = std::
             __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->currentBuffer_);
    FixedBuffer<4000000>::append(peVar3,logline,(long)lock.mutex._4_4_);
    Condition::notify(&this->cond_);
  }
  MutexLockGuard::~MutexLockGuard(&local_28);
  return;
}

Assistant:

void AsyncLogging::append(const char* logline, int len) {
  MutexLockGuard lock(mutex_);
  if (currentBuffer_->avail() > len)
    currentBuffer_->append(logline, len);
  else {
    buffers_.push_back(currentBuffer_);
    currentBuffer_.reset();
    if (nextBuffer_)
      currentBuffer_ = std::move(nextBuffer_);
    else
      currentBuffer_.reset(new Buffer);
    currentBuffer_->append(logline, len);
    cond_.notify();
  }
}